

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_stream_data_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  undefined1 *puVar1;
  uint8_t *end;
  int iVar2;
  uint64_t stream_id;
  uint64_t uVar3;
  quicly_stream_t *stream;
  int iVar4;
  
  end = state->end;
  stream_id = ptls_decode_quicint(&state->src,end);
  iVar4 = 0x20007;
  if (stream_id != 0xffffffffffffffff) {
    uVar3 = ptls_decode_quicint(&state->src,end);
    if ((uVar3 != 0xffffffffffffffff) &&
       (((stream_id & 0x8000000000000002) != 2 ||
        ((((uint)(conn->super).local.bidi.next_stream_id ^ (uint)stream_id) & 1) != 0)))) {
      stream = quicly_get_stream(conn,stream_id);
      iVar4 = 0;
      if (stream != (quicly_stream_t *)0x0) {
        puVar1 = &(stream->_send_aux).max_stream_data_sender.field_0x18;
        *puVar1 = *puVar1 | 1;
        iVar2 = should_send_max_stream_data(stream);
        iVar4 = 0;
        if (iVar2 != 0) {
          sched_stream_control(stream);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int handle_stream_data_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_data_blocked_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stream_data_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(STREAM_DATA_BLOCKED_RECEIVE, conn, conn->stash.now, frame.stream_id, frame.offset);

    if (!quicly_stream_has_receive_side(quicly_is_client(conn), frame.stream_id))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((stream = quicly_get_stream(conn, frame.stream_id)) != NULL) {
        quicly_maxsender_request_transmit(&stream->_send_aux.max_stream_data_sender);
        if (should_send_max_stream_data(stream))
            sched_stream_control(stream);
    }

    return 0;
}